

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highwayhash.h
# Opt level: O2

void __thiscall
highwayhash::HighwayHashCatT<4U>::Finalize<unsigned_long>
          (HighwayHashCatT<4U> *this,unsigned_long *hash)

{
  HHStateT<4U> state_copy;
  HHStateAVX2 local_c0;
  
  local_c0.v0.v_[0] = (this->state_).v0.v_[0];
  local_c0.v0.v_[1] = (this->state_).v0.v_[1];
  local_c0.v0.v_[2] = (this->state_).v0.v_[2];
  local_c0.v0.v_[3] = (this->state_).v0.v_[3];
  local_c0.v1.v_[0] = (this->state_).v1.v_[0];
  local_c0.v1.v_[1] = (this->state_).v1.v_[1];
  local_c0.v1.v_[2] = (this->state_).v1.v_[2];
  local_c0.v1.v_[3] = (this->state_).v1.v_[3];
  local_c0.mul0.v_[0] = (this->state_).mul0.v_[0];
  local_c0.mul0.v_[1] = (this->state_).mul0.v_[1];
  local_c0.mul0.v_[2] = (this->state_).mul0.v_[2];
  local_c0.mul0.v_[3] = (this->state_).mul0.v_[3];
  local_c0.mul1.v_[0] = (this->state_).mul1.v_[0];
  local_c0.mul1.v_[1] = (this->state_).mul1.v_[1];
  local_c0.mul1.v_[2] = (this->state_).mul1.v_[2];
  local_c0.mul1.v_[3] = (this->state_).mul1.v_[3];
  if (this->buffer_usage_ != 0) {
    AVX2::HHStateAVX2::UpdateRemainder(&local_c0,this->buffer_,this->buffer_usage_);
  }
  AVX2::HHStateAVX2::Finalize(&local_c0,hash);
  return;
}

Assistant:

HH_INLINE void Finalize(Result* HH_RESTRICT hash) const {
    // BeginIACA();
    HHStateT<Target> state_copy = state_;
    const size_t buffer_usage = buffer_usage_;
    if (HH_LIKELY(buffer_usage != 0)) {
      state_copy.UpdateRemainder(buffer_, buffer_usage);
    }
    state_copy.Finalize(hash);
    // EndIACA();
  }